

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Classes.cpp
# Opt level: O0

string * __thiscall
chatra::toString_abi_cxx11_
          (string *__return_storage_ptr__,chatra *this,StringTable *sTable,ArgumentSpec *arg)

{
  ArgumentSpec *this_00;
  StringId id;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_48;
  undefined1 local_21;
  StringTable *local_20;
  ArgumentSpec *arg_local;
  StringTable *sTable_local;
  string *ret;
  
  local_21 = 0;
  local_20 = sTable;
  arg_local = (ArgumentSpec *)this;
  sTable_local = (StringTable *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (local_20->baseVersion != 0xffffffff) {
    StringTable::ref_abi_cxx11_(&local_48,(StringTable *)arg_local,local_20->baseVersion);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  this_00 = arg_local;
  if ((local_20->strToId)._M_h._M_buckets != (__buckets_ptr)0x0) {
    id = Class::getName((Class *)(local_20->strToId)._M_h._M_buckets);
    StringTable::ref_abi_cxx11_(&local_98,(StringTable *)this_00,id);
    std::operator+(&local_78,":",&local_98);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toString(const StringTable* sTable, const ArgumentSpec& arg) {
	std::string ret;
	if (arg.key != StringId::Invalid)
		ret += sTable->ref(arg.key);
	if (arg.cl != nullptr)
		ret += ":" + sTable->ref(arg.cl->getName());
	return ret;
}